

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

string * __thiscall
Catch::StringMaker<float,void>::convert_abi_cxx11_
          (string *__return_storage_ptr__,StringMaker<float,void> *this,float value)

{
  long lVar1;
  long lVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  ReusableStringStream rss;
  string local_38 [32];
  
  if (NAN(value)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_68,"nan",(allocator<char> *)local_38);
  }
  else {
    lVar2 = (long)precision;
    ReusableStringStream::ReusableStringStream(&rss);
    lVar1 = *(long *)rss.m_oss;
    *(long *)(rss.m_oss + *(long *)(lVar1 + -0x18) + 8) = lVar2;
    lVar1 = *(long *)(lVar1 + -0x18);
    *(uint *)(rss.m_oss + lVar1 + 0x18) = *(uint *)(rss.m_oss + lVar1 + 0x18) & 0xfffffefb | 4;
    std::ostream::operator<<(rss.m_oss,value);
    std::__cxx11::stringbuf::str();
    lVar1 = std::__cxx11::string::find_last_not_of((char)&local_68,0x30);
    if ((lVar1 != -1) && (lVar1 != local_68._M_string_length - 1)) {
      std::__cxx11::string::substr((ulong)local_38,(ulong)&local_68);
      std::__cxx11::string::operator=((string *)&local_68,local_38);
      std::__cxx11::string::~string(local_38);
    }
    ReusableStringStream::~ReusableStringStream(&rss);
  }
  std::operator+(__return_storage_ptr__,&local_68,'f');
  std::__cxx11::string::~string((string *)&local_68);
  return __return_storage_ptr__;
}

Assistant:

std::string StringMaker<float>::convert(float value) {
    return Detail::fpToString(value, precision) + 'f';
}